

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conditions.cc
# Opt level: O0

bool __thiscall
absl::lts_20240722::log_internal::LogEveryNSecState::ShouldLog
          (LogEveryNSecState *this,double seconds)

{
  int64_t iVar1;
  atomic<long> *paVar2;
  __atomic_base<long> _Var3;
  double dVar4;
  double dVar5;
  __atomic_base<long> local_78;
  int64_t next_cycles;
  int64_t now_cycles;
  double seconds_local;
  LogEveryNSecState *this_local;
  __int_type_conflict local_50;
  memory_order local_48;
  int local_44;
  memory_order __b;
  undefined1 local_31;
  long local_30;
  undefined4 local_28;
  undefined4 local_24;
  long local_20;
  __atomic_base<long> *local_18;
  atomic<long> *local_10;
  
  now_cycles = (int64_t)seconds;
  seconds_local = (double)this;
  anon_unknown_1::LossyIncrement(&this->counter_);
  next_cycles = base_internal::CycleClock::Now();
  paVar2 = &this->next_log_time_cycles_;
  local_44 = 0;
  ___b = paVar2;
  local_48 = std::operator&(memory_order_relaxed,__memory_order_mask);
  if (local_44 - 1U < 2) {
    local_50 = (paVar2->super___atomic_base<long>)._M_i;
  }
  else if (local_44 == 5) {
    local_50 = (paVar2->super___atomic_base<long>)._M_i;
  }
  else {
    local_50 = (paVar2->super___atomic_base<long>)._M_i;
  }
  local_78._M_i = local_50;
  do {
    iVar1 = now_cycles;
    if (next_cycles <= local_78._M_i) {
      return false;
    }
    paVar2 = &this->next_log_time_cycles_;
    dVar4 = (double)next_cycles;
    dVar5 = base_internal::CycleClock::Frequency();
    local_30 = (long)((double)iVar1 * dVar5 + dVar4);
    local_18 = &local_78;
    local_24 = 0;
    local_28 = 0;
    LOCK();
    _Var3._M_i = (paVar2->super___atomic_base<long>)._M_i;
    local_31 = local_78._M_i == _Var3._M_i;
    if ((bool)local_31) {
      (paVar2->super___atomic_base<long>)._M_i = local_30;
      _Var3._M_i = local_78._M_i;
    }
    UNLOCK();
    local_78._M_i = _Var3._M_i;
    local_20 = local_30;
    local_10 = paVar2;
  } while (!(bool)local_31);
  return true;
}

Assistant:

bool LogEveryNSecState::ShouldLog(double seconds) {
  using absl::base_internal::CycleClock;
  LossyIncrement(&counter_);
  const int64_t now_cycles = CycleClock::Now();
  int64_t next_cycles = next_log_time_cycles_.load(std::memory_order_relaxed);
#if defined(__myriad2__)
  // myriad2 does not have 8-byte compare and exchange.  Use a racy version that
  // is "good enough" but will over-log in the face of concurrent logging.
  if (now_cycles > next_cycles) {
    next_log_time_cycles_.store(now_cycles + seconds * CycleClock::Frequency(),
                                std::memory_order_relaxed);
    return true;
  }
  return false;
#else
  do {
    if (now_cycles <= next_cycles) return false;
  } while (!next_log_time_cycles_.compare_exchange_weak(
      next_cycles, now_cycles + seconds * CycleClock::Frequency(),
      std::memory_order_relaxed, std::memory_order_relaxed));
  return true;
#endif
}